

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock.cc
# Opt level: O3

void btreeblk_init(btreeblk_handle *handle,filemgr *file,uint32_t nodesize)

{
  ulong uVar1;
  uint uVar2;
  btreeblk_subblocks *pbVar3;
  uint8_t *__s;
  uint uVar4;
  size_t __size;
  ulong uVar5;
  ulong __size_00;
  uint8_t **ppuVar6;
  
  handle->file = file;
  handle->nodesize = nodesize;
  handle->nnodeperblock = (uint16_t)(file->blocksize / nodesize);
  (handle->blockpool).head = (list_elem *)0x0;
  (handle->blockpool).tail = (list_elem *)0x0;
  handle->nlivenodes = 0;
  handle->ndeltanodes = 0;
  (handle->alc_list).head = (list_elem *)0x0;
  (handle->alc_list).tail = (list_elem *)0x0;
  (handle->read_list).head = (list_elem *)0x0;
  (handle->read_list).tail = (list_elem *)0x0;
  handle->dirty_update = (filemgr_dirty_update_node *)0x0;
  handle->dirty_update_writer = (filemgr_dirty_update_node *)0x0;
  if (nodesize < 0x81) {
    handle->nsb = 0;
    handle->sb = (btreeblk_subblocks *)0x0;
  }
  else {
    uVar2 = 0x80;
    __size = 0;
    uVar5 = 0;
    do {
      uVar2 = uVar2 * 2;
      uVar1 = uVar5 + 1;
      __size = __size + 0x18;
      if (nodesize <= uVar2) break;
      uVar4 = (uint)uVar5;
      uVar5 = uVar1;
    } while (uVar4 < 4);
    handle->nsb = (uint32_t)uVar1;
    pbVar3 = (btreeblk_subblocks *)malloc(__size);
    handle->sb = pbVar3;
    ppuVar6 = &pbVar3->bitmap;
    uVar2 = 0x80;
    uVar5 = 0;
    do {
      ((btreeblk_subblocks *)(ppuVar6 + -2))->bid = 0xffffffffffffffff;
      *(uint *)(ppuVar6 + -1) = uVar2;
      *(uint16_t *)((long)ppuVar6 + -4) = (uint16_t)((ulong)nodesize / (ulong)uVar2);
      __size_00 = (ulong)nodesize / (ulong)uVar2 & 0xffff;
      __s = (uint8_t *)malloc(__size_00);
      *ppuVar6 = __s;
      memset(__s,0,__size_00);
      uVar2 = uVar2 * 2;
      uVar5 = uVar5 + 1;
      ppuVar6 = ppuVar6 + 3;
    } while (uVar5 < uVar1);
  }
  return;
}

Assistant:

void btreeblk_init(struct btreeblk_handle *handle, struct filemgr *file,
                   uint32_t nodesize)
{
    uint32_t i;
    uint32_t _nodesize;

    handle->file = file;
    handle->nodesize = nodesize;
    handle->nnodeperblock = handle->file->blocksize / handle->nodesize;
    handle->nlivenodes = 0;
    handle->ndeltanodes = 0;
    handle->dirty_update = NULL;
    handle->dirty_update_writer = NULL;

    list_init(&handle->alc_list);
    list_init(&handle->read_list);

#ifdef __BTREEBLK_BLOCKPOOL
    list_init(&handle->blockpool);
#endif

    // compute # subblock sets
    _nodesize = BTREEBLK_MIN_SUBBLOCK;
    for (i=0; (_nodesize < nodesize && i<5); ++i){
        _nodesize = _nodesize << 1;
    }
    handle->nsb = i;
    if (handle->nsb) {
        handle->sb = (struct btreeblk_subblocks*)
                     malloc(sizeof(struct btreeblk_subblocks) * handle->nsb);
        // initialize each subblock set
        _nodesize = BTREEBLK_MIN_SUBBLOCK;
        for (i=0;i<handle->nsb;++i){
            handle->sb[i].bid = BLK_NOT_FOUND;
            handle->sb[i].sb_size = _nodesize;
            handle->sb[i].nblocks = nodesize / _nodesize;
            handle->sb[i].bitmap = (uint8_t*)malloc(handle->sb[i].nblocks);
            memset(handle->sb[i].bitmap, 0, handle->sb[i].nblocks);
            _nodesize = _nodesize << 1;
        }
    } else {
        handle->sb = NULL;
    }
}